

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessageDescriptors(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x58)) {
    lVar3 = 0;
    lVar2 = 0;
    do {
      PrintDescriptor(this,(Descriptor *)(*(long *)(pFVar1 + 0x60) + lVar3));
      io::Printer::Print(this->printer_,"\n");
      lVar2 = lVar2 + 1;
      pFVar1 = this->file_;
      lVar3 = lVar3 + 0xa8;
    } while (lVar2 < *(int *)(pFVar1 + 0x58));
  }
  return;
}

Assistant:

void Generator::PrintMessageDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    PrintDescriptor(*file_->message_type(i));
    printer_->Print("\n");
  }
}